

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O1

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
::set_activity_observer
          (ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
           *this,Observer *observer)

{
  Jasmin::set_activity_observer(&this->jasmin_,observer);
  return;
}

Assistant:

void set_activity_observer(Activity::Observer *observer) final {
			switch(disk_interface) {
				default: break;
				case DiskInterface::BD500:
					bd500_.set_activity_observer(observer);
				break;
				case DiskInterface::Jasmin:
					jasmin_.set_activity_observer(observer);
				break;
				case DiskInterface::Microdisc:
					microdisc_.set_activity_observer(observer);
				break;
				case DiskInterface::Pravetz:
					diskii_->set_activity_observer(observer);
				break;
			}
		}